

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O2

double __thiscall BRTS_XZ<UFPC>::Alloc(BRTS_XZ<UFPC> *this)

{
  PerformanceEvaluator *perf;
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  double dVar6;
  Size local_80;
  Mat local_78 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  perf = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  dVar6 = UFPC::Alloc(((*(int *)&pMVar4->field_0x8 + 1) / 2) *
                      ((*(int *)&pMVar4->field_0xc + 1) / 2) + 1,perf);
  PerformanceEvaluator::start(perf);
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_80.height = (int)uVar1;
  local_80.width = (int)((ulong)uVar1 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_78,&local_80);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_78);
  cv::Mat::~Mat(local_78);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  Data_Compressed::Alloc
            (&this->data_compressed,*(int *)&pMVar4->field_0x8,*(int *)&pMVar4->field_0xc);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  PerformanceEvaluator::stop(perf);
  dVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  Runs::Alloc(&this->data_runs,*(int *)&pMVar4->field_0x8,*(int *)&pMVar4->field_0xc);
  PerformanceEvaluator::start(perf);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  PerformanceEvaluator::stop(perf);
  return dVar6 + ((dVar2 * 1000.0) / dVar3 -
                 ((this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
                  last * 1000.0) /
                 (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                 tick_frequency_);
}

Assistant:

double Alloc() {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);

        // Memory allocation for others
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        data_compressed.Alloc(img_.rows, img_.cols);
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        perf_.stop();
        double t = perf_.last();

        // Run metadata allocation time will be calculated later
        data_runs.Alloc(img_.rows, img_.cols);

        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }